

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* phosg::list_directory
            (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *dirname)

{
  DIR *__dirp;
  dirent *pdVar1;
  cannot_open_file *this;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  __dirp = opendir((dirname->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    this = (cannot_open_file *)__cxa_allocate_exception(0x20);
    cannot_open_file::cannot_open_file(this,dirname);
    __cxa_throw(this,&cannot_open_file::typeinfo,cannot_open_file::~cannot_open_file);
  }
  while (pdVar1 = readdir(__dirp), pdVar1 != (dirent *)0x0) {
    if ((pdVar1->d_name[0] != '.') ||
       ((pdVar1->d_name[1] != '\0' && ((pdVar1->d_name[1] != '.' || (pdVar1->d_name[2] != '\0'))))))
    {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_M_emplace<char(&)[256]>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__,pdVar1->d_name);
    }
  }
  closedir(__dirp);
  return __return_storage_ptr__;
}

Assistant:

unordered_set<string> list_directory(const string& dirname) {
  unordered_set<string> files;

  DIR* dir = opendir(dirname.c_str());
  if (dir == nullptr) {
    throw cannot_open_file(dirname);
  }

  struct dirent* entry;
  while ((entry = readdir(dir))) {
    if (!strcmp(entry->d_name, ".") || !strcmp(entry->d_name, "..")) {
      continue;
    }
    files.emplace(entry->d_name);
  }

  closedir(dir);

  return files;
}